

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O2

Color __thiscall
RoughConductorBRDF::sample_f
          (RoughConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  vec3f *a;
  float u1;
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Da;
  float u2;
  float fVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  float fVar6;
  float fVar7;
  vec3f wm;
  vec3f v;
  Color CVar8;
  vec3f local_38;
  
  (*sampler->_vptr_Sampler[1])();
  wm = schuttejoe::GgxVndf((schuttejoe *)sampler,*wo,this->alpha,u1,u2);
  fVar6 = wm.z;
  fVar7 = wm.x;
  fVar4 = wm.y;
  fVar1 = wo->z * fVar6 + wo->x * fVar7 + wo->y * fVar4;
  fVar1 = fVar1 + fVar1;
  local_38.z = fVar6 * fVar1;
  a = &local_38;
  local_38.y = fVar1 * fVar4;
  local_38.x = fVar1 * fVar7;
  v = operator-(a,wo);
  wi->x = (float)(int)v._0_8_;
  wi->y = (float)(int)((ulong)v._0_8_ >> 0x20);
  wi->z = v.z;
  fVar1 = EDX::Smith_G1(v,wm,this->alpha);
  fVar2 = EDX::GGX_D((EDX *)a,wm,this->alpha);
  *pdf = (ABS(wo->z * fVar6 + wo->x * fVar7 + wo->y * fVar4) * fVar2 * fVar1) /
         (ABS(wo->z) * ABS(fVar6 * wi->z + wi->x * fVar7 + fVar4 * wi->y) * 4.0);
  fVar7 = 0.0;
  uVar3 = 0;
  uVar5 = 0;
  if (wi->z < 0.0 == wo->z < 0.0) {
    (*(this->super_BRDF)._vptr_BRDF[1])(this,albedo,wo,wi);
    uVar3 = extraout_XMM0_Da;
    uVar5 = extraout_XMM0_Db;
  }
  CVar8.y = (float)uVar5;
  CVar8.x = (float)uVar3;
  CVar8.z = fVar7;
  return CVar8;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		vec2f u = sampler.get2f();
    	vec3f wm = schuttejoe::GgxVndf(wo, alpha, u.x, u.y);
		wi = 2*dot(wm,wo)*wm-wo;
		// http://jcgt.org/published/0007/04/01/paper.pdf Eric Heitz
		pdf = EDX::Smith_G1(wi, wm, alpha) * EDX::GGX_D(wm,alpha) * fabs(dot(wo,wm)) / (4 * fabs(dot(wi, wm)) * fabs(wo.z));
    	if (wi.z<0 ^ wo.z<0) return 0;
    	return f(albedo, wo, wi);
	}